

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O2

void av1_k_means_dim2(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  byte bVar1;
  int16_t *__s1;
  int iVar2;
  int iVar3;
  int16_t *piVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  int64_t this_dist;
  int16_t *meta_centroids [2];
  uint8_t *meta_indices [2];
  int count [8];
  int16_t centroids_tmp [16];
  int centroids_sum [16];
  uint8_t indices_tmp [4096];
  long local_1130;
  uint local_1124;
  int local_1120;
  int local_111c;
  size_t local_1118;
  ulong local_1110;
  int16_t *local_1108 [4];
  uint8_t *local_10e8;
  size_t local_10e0;
  long local_10d8;
  ulong local_10d0;
  uint8_t *local_10c8 [2];
  int local_10b8 [8];
  undefined1 local_1098 [32];
  int local_1078 [16];
  undefined1 local_1038 [4104];
  
  local_1108[1] = (int16_t *)local_1098;
  local_10c8[1] = local_1038;
  local_1108[0] = centroids;
  local_1108[3] = centroids;
  local_10c8[0] = indices;
  (*av1_calc_indices_dim2)(data,centroids,indices,&local_1130,n,k);
  local_10e0 = (long)k * 8;
  uVar10 = 0;
  if (0 < n) {
    uVar10 = (ulong)(uint)n;
  }
  uVar11 = 0;
  if (0 < k) {
    uVar11 = (ulong)(uint)k;
  }
  local_1118 = (long)k << 2;
  local_1120 = 0;
  if (0 < max_itr) {
    local_1120 = max_itr;
  }
  local_10e8 = indices;
  uVar7 = 0;
  iVar2 = 0;
  local_111c = k;
  do {
    if (iVar2 == local_1120) {
      uVar5 = (ulong)uVar7;
      uVar7 = 0;
      iVar2 = local_1120;
LAB_001cde4d:
      uVar6 = (uint)uVar5;
      if (iVar2 != max_itr) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        memcpy(local_1108[3],local_1098,local_1118);
        memcpy(local_10e8,local_1038,(long)n);
      }
      return;
    }
    local_10d8 = local_1130;
    local_1110 = (ulong)(uVar7 ^ 1);
    __s1 = local_1108[local_1110];
    local_10d0 = (ulong)uVar7;
    local_10b8[4] = 0;
    local_10b8[5] = 0;
    local_10b8[6] = 0;
    local_10b8[7] = 0;
    local_10b8[0] = 0;
    local_10b8[1] = 0;
    local_10b8[2] = 0;
    local_10b8[3] = 0;
    uVar6 = (uint)*data;
    local_1124 = uVar7;
    memset(local_1078,0,local_10e0);
    piVar4 = data;
    for (uVar5 = 0; uVar5 != uVar10; uVar5 = uVar5 + 1) {
      bVar1 = indices[uVar5];
      local_10b8[bVar1] = local_10b8[bVar1] + 1;
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        local_1078[(ulong)bVar1 * 2 + lVar8] =
             local_1078[(ulong)bVar1 * 2 + lVar8] + (int)piVar4[lVar8];
      }
      piVar4 = piVar4 + 2;
    }
    piVar9 = local_1078;
    piVar4 = __s1;
    for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
      iVar3 = local_10b8[uVar5];
      if (iVar3 == 0) {
        uVar6 = uVar6 * 0x41c64e6d + 0x3039;
        *(undefined4 *)(__s1 + uVar5 * 2) =
             *(undefined4 *)((long)data + (ulong)((uVar6 >> 0x10 & 0x7fff) % (uint)n << 2));
      }
      else {
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          piVar4[lVar8] = (int16_t)((piVar9[lVar8] + (iVar3 >> 1)) / iVar3);
        }
      }
      piVar9 = piVar9 + 2;
      piVar4 = piVar4 + 2;
    }
    iVar3 = bcmp(__s1,local_1108[local_10d0],local_1118);
    uVar5 = local_1110;
    if (iVar3 == 0) {
      uVar7 = 0;
      goto LAB_001cde4d;
    }
    indices = local_10c8[local_1110];
    (*av1_calc_indices_dim2)(data,__s1,indices,&local_1130,n,local_111c);
    uVar7 = local_1124;
    if (local_10d8 < local_1130) goto LAB_001cde4d;
    iVar2 = iVar2 + 1;
    uVar7 = (uint)uVar5;
  } while( true );
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}